

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMixedMeshControl::Print(TPZMHMixedMeshControl *this,ostream *out)

{
  TPZReference *pTVar1;
  TPZGeoMesh *pTVar2;
  TPZReference *pTVar3;
  TPZCompMesh *pTVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Self __tmp_1;
  ulong uVar7;
  _Self __tmp;
  
  pTVar1 = (this->super_TPZMHMeshControl).fGMesh.fRef;
  if ((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZGeoMesh *)0x0)) {
    std::operator<<(out,"******************* GEOMETRIC MESH *****************\n");
    pTVar2 = ((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer;
    (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[9])(pTVar2,out);
  }
  pTVar3 = (this->fFluxMesh).fRef;
  if ((pTVar3 != (TPZReference *)0x0) && (pTVar3->fPointer != (TPZCompMesh *)0x0)) {
    std::operator<<(out,"******************* FLUX MESH *****************\n");
    pTVar4 = ((this->fFluxMesh).fRef)->fPointer;
    (**(code **)(*(long *)pTVar4 + 0x68))(pTVar4,out);
  }
  pTVar3 = (this->super_TPZMHMeshControl).fPressureFineMesh.fRef;
  if ((pTVar3 != (TPZReference *)0x0) && (pTVar3->fPointer != (TPZCompMesh *)0x0)) {
    std::operator<<(out,"******************* PRESSURE MESH *****************\n");
    pTVar4 = ((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer;
    (**(code **)(*(long *)pTVar4 + 0x68))(pTVar4,out);
  }
  pTVar3 = (this->super_TPZMHMeshControl).fCMesh.fRef;
  if ((pTVar3 != (TPZReference *)0x0) && (pTVar3->fPointer != (TPZCompMesh *)0x0)) {
    std::operator<<(out,"******************* COMPUTATIONAL MESH *****************\n");
    pTVar4 = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
    (**(code **)(*(long *)pTVar4 + 0x68))(pTVar4,out);
  }
  pTVar3 = (this->super_TPZMHMeshControl).fCMeshLagrange.fRef;
  if ((pTVar3 != (TPZReference *)0x0) && (pTVar3->fPointer != (TPZCompMesh *)0x0)) {
    std::operator<<(out,"******************* LAGRANGE MULTIPLIER MESH *****************\n");
    pTVar4 = ((this->super_TPZMHMeshControl).fCMeshLagrange.fRef)->fPointer;
    (**(code **)(*(long *)pTVar4 + 0x68))(pTVar4,out);
  }
  pTVar3 = (this->super_TPZMHMeshControl).fCMeshConstantPressure.fRef;
  if ((pTVar3 != (TPZReference *)0x0) && (pTVar3->fPointer != (TPZCompMesh *)0x0)) {
    std::operator<<(out,"******************* CONSTANTE PRESSURE MESH *****************\n");
    pTVar4 = ((this->super_TPZMHMeshControl).fCMeshConstantPressure.fRef)->fPointer;
    (**(code **)(*(long *)pTVar4 + 0x68))(pTVar4,out);
  }
  poVar5 = std::operator<<(out,"Skeleton Mat Id ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->super_TPZMHMeshControl).fSkeletonMatId)
  ;
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(out,"Lagrange mat id left - right ");
  poVar5 = (ostream *)
           std::ostream::operator<<(poVar5,(this->super_TPZMHMeshControl).fLagrangeMatIdLeft);
  poVar5 = std::operator<<(poVar5," - ");
  poVar5 = (ostream *)
           std::ostream::operator<<(poVar5,(this->super_TPZMHMeshControl).fLagrangeMatIdRight);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(out,"Internal polynomial order ");
  poVar5 = (ostream *)
           std::ostream::operator<<(poVar5,(this->super_TPZMHMeshControl).fpOrderInternal);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(out,"Skeleton polynomial order ");
  poVar5 = (ostream *)
           std::ostream::operator<<(poVar5,(this->super_TPZMHMeshControl).fpOrderSkeleton);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(out,"Geometric element indices of the coarse mesh ");
  for (p_Var6 = (this->super_TPZMHMeshControl).fMHMtoSubCMesh._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var6 !=
      &(this->super_TPZMHMeshControl).fMHMtoSubCMesh._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::ostream::_M_insert<long>((long)out);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::operator<<(poVar5," ");
  }
  std::endl<char,std::char_traits<char>>(out);
  std::operator<<(out,
                  "Skeleton element indices with associated left and right coarse element indices\n"
                 );
  for (p_Var6 = (this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var6 !=
      &(this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::operator<<(out,"skel index ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5," Left Right indices ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  poVar5 = std::operator<<(out,"Will generate a constant pressure mesh ");
  poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(out,"Subdomain indices of the connects by mesh\n");
  for (p_Var6 = (this->super_TPZMHMeshControl).fConnectToSubDomainIdentifier._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 !=
      &(this->super_TPZMHMeshControl).fConnectToSubDomainIdentifier._M_t._M_impl.
       super__Rb_tree_header; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::operator<<(out,"Computational mesh pointer ");
    poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    for (uVar7 = 0; (long)uVar7 < (long)p_Var6[1]._M_right; uVar7 = uVar7 + 1) {
      if ((uVar7 != 0) && ((uVar7 / 0x14) * 0x14 - uVar7 == 0)) {
        std::endl<char,std::char_traits<char>>(out);
      }
      poVar5 = std::operator<<(out,"(");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,"->");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::operator<<(poVar5,") ");
    }
    std::endl<char,std::char_traits<char>>(out);
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::Print(std::ostream &out)
{
    
    /// geometric mesh used to create the computational mesh
    if (fGMesh)
    {
        out << "******************* GEOMETRIC MESH *****************\n";
        fGMesh->Print(out);
    }
    
    /// computational mesh to contain the pressure elements
    // this mesh is the same as fCMesh if there are no lagrange multipliers assocated with the average pressure
    if (fFluxMesh)
    {
        out << "******************* FLUX MESH *****************\n";
        fFluxMesh->Print(out);
    }
    
    /// computational mesh to contain the pressure elements
    // this mesh is the same as fCMesh if there are no lagrange multipliers assocated with the average pressure
    if (fPressureFineMesh)
    {
        out << "******************* PRESSURE MESH *****************\n";
        fPressureFineMesh->Print(out);
    }
    
    
    /// computational MHM mesh being built by this class
    if (fCMesh)
    {
        out << "******************* COMPUTATIONAL MESH *****************\n";
        fCMesh->Print(out);
    }
    
    /// computational mesh to represent the constant states
    if (fCMeshLagrange)
    {
        out << "******************* LAGRANGE MULTIPLIER MESH *****************\n";
        fCMeshLagrange->Print(out);
    }
    
    /// computational mesh to represent the constant states
    if (fCMeshConstantPressure)
    {
        out << "******************* CONSTANTE PRESSURE MESH *****************\n";
        fCMeshConstantPressure->Print(out);
    }
    
    /// material id associated with the skeleton elements
    out << "Skeleton Mat Id " <<  fSkeletonMatId << std::endl;
    
    /// material id associated with the lagrange multiplier elements
    out << "Lagrange mat id left - right " <<  fLagrangeMatIdLeft << " - " << fLagrangeMatIdRight << std::endl;
    
    /// interpolation order of the internal elements
    out << "Internal polynomial order " <<  fpOrderInternal << std::endl;
    
    /// interpolation order of the skeleton elements
    out << "Skeleton polynomial order " << fpOrderSkeleton << std::endl;
    
    /// indices of the geometric elements which define the skeleton mesh
    {
        out << "Geometric element indices of the coarse mesh ";
        for (std::map<int64_t,int64_t>::iterator it= fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
            out << it->first << " " << it->second << " ";
        }
        out << std::endl;
    }
    /// indices of the skeleton elements and their left/right elements of the skeleton mesh
    out << "Skeleton element indices with associated left and right coarse element indices\n";
    {
        std::map<int64_t, std::pair<int64_t,int64_t> >::iterator it;
        for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
            out << "skel index " << it->first << " Left Right indices " << it->second.first << " " << it->second.second << std::endl;
        }
    }
    
    /// flag to determine whether a lagrange multiplier is included to force zero average pressures in the subdomains
    /**
     * when imposing average pressure to be zero, a multiphysics mesh is created
     */
    out << "Will generate a constant pressure mesh " <<  fLagrangeAveragePressure << std::endl;
    /// subdonain indices of the connects
    out << "Subdomain indices of the connects by mesh\n";
    for (auto it = fConnectToSubDomainIdentifier.begin(); it != fConnectToSubDomainIdentifier.end(); it++) {
        TPZCompMesh *cmesh = it->first;
        TPZManVector<int64_t> &cvec = it->second;
        out << "Computational mesh pointer " << (void *) cmesh << std::endl;
        for (int64_t i=0; i<cvec.size(); i++) {
            if (i && !(i%20)) {
                out << std::endl;
            }
            out << "(" << i << "->" << cvec[i] << ") ";
        }
        out << std::endl;
    }
    
}